

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O2

Node * __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::Node::FindChild
          (Node *this,StringPiece name)

{
  pointer ppNVar1;
  bool bVar2;
  Node *pNVar3;
  int i;
  ulong uVar4;
  StringPiece local_40;
  
  pNVar3 = (Node *)0x0;
  if ((name.length_ != 0) && (this->kind_ == OBJECT)) {
    uVar4 = 0;
    do {
      ppNVar1 = (this->children_).
                super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->children_).
                        super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3) <= uVar4) {
        return (Node *)0x0;
      }
      pNVar3 = ppNVar1[uVar4];
      StringPiece::StringPiece<std::allocator<char>>(&local_40,&pNVar3->name_);
      bVar2 = operator==(local_40,name);
      uVar4 = uVar4 + 1;
    } while (!bVar2);
  }
  return pNVar3;
}

Assistant:

DefaultValueObjectWriter::Node* DefaultValueObjectWriter::Node::FindChild(
    StringPiece name) {
  if (name.empty() || kind_ != OBJECT) {
    return nullptr;
  }
  for (int i = 0; i < children_.size(); ++i) {
    Node* child = children_[i];
    if (child->name() == name) {
      return child;
    }
  }
  return nullptr;
}